

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_checkstack(FuncState *fs,int n)

{
  int iVar1;
  int newstack;
  int n_local;
  FuncState *fs_local;
  
  iVar1 = (uint)fs->freereg + n;
  if ((int)(uint)fs->f->maxstacksize < iVar1) {
    if (0xfe < iVar1) {
      luaX_syntaxerror(fs->ls,"function or expression needs too many registers");
    }
    fs->f->maxstacksize = (lu_byte)iVar1;
  }
  return;
}

Assistant:

void luaK_checkstack(FuncState *fs, int n) {
    int newstack = fs->freereg + n;
    if (newstack > fs->f->maxstacksize) {
        if (newstack >= MAXREGS)
            luaX_syntaxerror(fs->ls,
                             "function or expression needs too many registers");
        fs->f->maxstacksize = cast_byte(newstack);
    }
}